

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getRhoh(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters local_118;
  
  getZhouParam(&local_118,this);
  ZhouParameters::~ZhouParameters(&local_118);
  return local_118.rhoh;
}

Assistant:

RealType EAMAdapter::getRhoh() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.rhoh;
  }